

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ObjIsRo(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 0;
  if ((~*(uint *)pObj & 0x9fffffff) == 0) {
    iVar2 = Gia_ObjCioId(pObj);
    uVar1 = (uint)(p->vCis->nSize - p->nRegs <= iVar2);
  }
  return uVar1;
}

Assistant:

static inline int          Gia_ObjIsRo( Gia_Man_t * p, Gia_Obj_t * pObj )      { return Gia_ObjIsCi(pObj) && Gia_ObjCioId(pObj) >= Gia_ManPiNum(p);  }